

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_utils.cc
# Opt level: O0

void draco::ConvertSymbolsToSignedInts(uint32_t *in,int in_values,int32_t *out)

{
  type tVar1;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    tVar1 = ConvertSymbolToSignedInt<unsigned_int>(*(uint *)(in_RDI + (long)local_1c * 4));
    *(type *)(in_RDX + (long)local_1c * 4) = tVar1;
  }
  return;
}

Assistant:

void ConvertSymbolsToSignedInts(const uint32_t *in, int in_values,
                                int32_t *out) {
  for (int i = 0; i < in_values; ++i) {
    out[i] = ConvertSymbolToSignedInt(in[i]);
  }
}